

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O3

bool __thiscall
tcu::anon_unknown_3::pixelNearLineSegment(anon_unknown_3 *this,IVec2 *pixel,Vec2 *p0,Vec2 *p1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar2 = (float)(int)this + 0.5;
  fVar1 = (float)(int)pixel + 0.5;
  fVar6 = p1->m_data[0] - p0->m_data[0];
  fVar5 = p1->m_data[1] - p0->m_data[1];
  fVar3 = fVar2 - p0->m_data[0];
  fVar4 = fVar1 - p0->m_data[1];
  fVar7 = fVar6 * fVar4 - fVar3 * fVar5;
  fVar5 = fVar5 * fVar5 + fVar6 * fVar6 + 0.0;
  if ((fVar7 * fVar7 <= fVar5 + fVar5) &&
     (SQRT(fVar4 * fVar4 + fVar3 * fVar3 + 0.0) <= SQRT(fVar5) + 1.414)) {
    fVar2 = fVar2 - p1->m_data[0];
    fVar1 = fVar1 - p1->m_data[1];
    return SQRT(fVar1 * fVar1 + fVar2 * fVar2 + 0.0) <= SQRT(fVar5) + 1.414;
  }
  return false;
}

Assistant:

bool pixelNearLineSegment (const tcu::IVec2& pixel, const tcu::Vec2& p0, const tcu::Vec2& p1)
{
	const tcu::Vec2 pixelCenterPosition = tcu::Vec2((float)pixel.x() + 0.5f, (float)pixel.y() + 0.5f);

	// "Near" = Distance from the line to the pixel is less than 2 * pixel_max_radius. (pixel_max_radius = sqrt(2) / 2)
	const float maxPixelDistance		= 1.414f;
	const float maxPixelDistanceSquared	= 2.0f;

	// Near the line
	{
		const tcu::Vec2	line			= p1                  - p0;
		const tcu::Vec2	v				= pixelCenterPosition - p0;
		const float		crossProduct	= (line.x() * v.y() - line.y() * v.x());

		// distance to line: (line x v) / |line|
		//     |(line x v) / |line|| > maxPixelDistance
		// ==> (line x v)^2 / |line|^2 > maxPixelDistance^2
		// ==> (line x v)^2 > maxPixelDistance^2 * |line|^2

		if (crossProduct * crossProduct > maxPixelDistanceSquared * tcu::lengthSquared(line))
			return false;
	}

	// Between the endpoints
	{
		// distance from line endpoint 1 to pixel is less than line length + maxPixelDistance
		const float maxDistance = tcu::length(p1 - p0) + maxPixelDistance;

		if (tcu::length(pixelCenterPosition - p0) > maxDistance)
			return false;
		if (tcu::length(pixelCenterPosition - p1) > maxDistance)
			return false;
	}

	return true;
}